

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_node *n,xpath_allocator *alloc)

{
  char *pcVar1;
  char cVar2;
  xml_node_struct *pxVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  xpath_node local_28;
  
  pxVar3 = n->_root;
  if (pxVar3 == (xml_node_struct *)0x0) {
    return;
  }
  switch(this->_test) {
  case '\x01':
    if ((pxVar3->header & 7) != 1) {
      return;
    }
    goto LAB_0012349b;
  case '\x02':
    break;
  case '\x03':
    if ((pxVar3->header & 7) != 4) {
      return;
    }
    break;
  case '\x04':
    if ((pxVar3->header & 7) != 5) {
      return;
    }
    break;
  case '\x05':
    if (((pxVar3->header & 7) != 2) && ((pxVar3->header & 7) != 3)) {
      return;
    }
    break;
  case '\x06':
    if ((pxVar3->header & 7) != 5) {
      return;
    }
LAB_0012349b:
    pcVar4 = "";
    if (pxVar3->name != (char_t *)0x0) {
      pcVar4 = pxVar3->name;
    }
    bVar6 = strequal(pcVar4,(this->_data).string);
joined_r0x0012348d:
    if (!bVar6) {
      return;
    }
    break;
  case '\a':
    if ((pxVar3->header & 7) != 1) {
      return;
    }
    break;
  case '\b':
    if ((pxVar3->header & 7) != 1) {
      return;
    }
    cVar2 = *(this->_data).string;
    bVar6 = cVar2 == '\0';
    if (!bVar6) {
      pcVar4 = "";
      if (pxVar3->name != (char *)0x0) {
        pcVar4 = pxVar3->name;
      }
      if (*pcVar4 == cVar2) {
        lVar5 = 1;
        do {
          cVar2 = (this->_data).string[lVar5];
          bVar6 = cVar2 == '\0';
          if (bVar6) break;
          pcVar1 = pcVar4 + lVar5;
          lVar5 = lVar5 + 1;
        } while (*pcVar1 == cVar2);
      }
    }
    goto joined_r0x0012348d;
  default:
    __assert_fail("!\"Unknown axis\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0x1e00,
                  "void pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, const xml_node &, xpath_allocator *)"
                 );
  }
  local_28._node = (xml_node)n->_root;
  local_28._attribute._attr = (xml_attribute_struct *)0x0;
  xpath_node_set_raw::push_back(ns,&local_28,alloc);
  return;
}

Assistant:

PUGI__FN bool xml_node::operator!() const
	{
		return !_root;
	}